

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

void __thiscall cmCTest::cmCTest(cmCTest *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined8 *puVar4;
  bool bVar5;
  long lVar6;
  mapped_type *pmVar7;
  cmCTestBuildHandler *this_00;
  mapped_type *ppcVar8;
  cmCTestBuildAndTestHandler *this_01;
  cmCTestCoverageHandler *this_02;
  cmCTestScriptHandler *this_03;
  cmCTestTestHandler *this_04;
  cmCTestUpdateHandler *this_05;
  mapped_type this_06;
  cmCTestMemCheckHandler *this_07;
  cmCTestSubmitHandler *this_08;
  cmCTestUploadHandler *this_09;
  _Rb_tree_node_base *p_Var9;
  Part p;
  string *s;
  string outOnFail;
  string local_c8;
  t_TestingHandlers *local_a8;
  string *local_a0;
  string *local_98;
  PartMapType *local_90;
  string local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  string *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &(this->ConfigType).field_2;
  (this->ConfigType)._M_dataplus._M_p = (pointer)local_38;
  (this->ConfigType)._M_string_length = 0;
  (this->ConfigType).field_2._M_local_buf[0] = '\0';
  local_98 = &this->ScheduleType;
  local_40 = &(this->ScheduleType).field_2;
  (this->ScheduleType)._M_dataplus._M_p = (pointer)local_40;
  (this->ScheduleType)._M_string_length = 0;
  (this->ScheduleType).field_2._M_local_buf[0] = '\0';
  local_a0 = &this->StopTime;
  local_48 = &(this->StopTime).field_2;
  (this->StopTime)._M_dataplus._M_p = (pointer)local_48;
  (this->StopTime)._M_string_length = 0;
  (this->StopTime).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header;
  (this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58 = &this->CTestConfigFile;
  local_50 = &(this->CTestConfigFile).field_2;
  (this->CTestConfigFile)._M_dataplus._M_p = (pointer)local_50;
  (this->CTestConfigFile)._M_string_length = 0;
  (this->CTestConfigFile).field_2._M_local_buf[0] = '\0';
  p_Var2 = &(this->CTestConfiguration)._M_t._M_impl.super__Rb_tree_header;
  (this->CTestConfiguration)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CTestConfiguration)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->CTestConfiguration)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->CTestConfiguration)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->CTestConfiguration)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->CTestConfigurationOverwrites)._M_t._M_impl.super__Rb_tree_header;
  (this->CTestConfigurationOverwrites)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->CTestConfigurationOverwrites)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->CTestConfigurationOverwrites)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->CTestConfigurationOverwrites)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->CTestConfigurationOverwrites)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar6 = 0x160;
  do {
    puVar4 = (undefined8 *)((long)this + lVar6 + -0x27);
    *puVar4 = 0;
    puVar4[1] = 0;
    puVar4 = (undefined8 *)((long)this + lVar6 + -0x30);
    *puVar4 = 0;
    puVar4[1] = 0;
    *(long *)((long)this + lVar6 + -0x10) = (long)&this->RepeatTests + lVar6;
    *(undefined8 *)((long)this + lVar6 + -8) = 0;
    *(undefined1 *)((long)&this->RepeatTests + lVar6) = 0;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x420);
  local_a8 = &this->TestingHandlers;
  local_90 = &this->PartMap;
  p_Var2 = &(this->PartMap)._M_t._M_impl.super__Rb_tree_header;
  (this->PartMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PartMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->PartMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->PartMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->PartMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->CurrentTag)._M_dataplus._M_p = (pointer)&(this->CurrentTag).field_2;
  (this->CurrentTag)._M_string_length = 0;
  (this->CurrentTag).field_2._M_local_buf[0] = '\0';
  (this->SpecificTrack)._M_dataplus._M_p = (pointer)&(this->SpecificTrack).field_2;
  (this->SpecificTrack)._M_string_length = 0;
  (this->SpecificTrack).field_2._M_local_buf[0] = '\0';
  local_60 = &(this->BinaryDir).field_2;
  (this->BinaryDir)._M_dataplus._M_p = (pointer)local_60;
  (this->BinaryDir)._M_string_length = 0;
  (this->BinaryDir).field_2._M_local_buf[0] = '\0';
  local_68 = &(this->NotesFiles).field_2;
  (this->NotesFiles)._M_dataplus._M_p = (pointer)local_68;
  (this->NotesFiles)._M_string_length = 0;
  (this->NotesFiles).field_2._M_local_buf[0] = '\0';
  (this->InitialCommandLineArguments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->InitialCommandLineArguments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->InitialCommandLineArguments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var2 = &(this->Definitions)._M_t._M_impl.super__Rb_tree_header;
  (this->Definitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Definitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Definitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->Definitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->Definitions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->ParallelLevelSetInCli = false;
  this->TestLoad = 0;
  this->SubmitIndex = 0;
  this->TomorrowTag = false;
  this->Verbose = false;
  this->Debug = false;
  this->ShowLineNumbers = false;
  this->Quiet = false;
  this->ExtraVerbose = false;
  this->ProduceXML = false;
  this->LabelSummary = true;
  this->SubprojectSummary = true;
  this->UseHTTP10 = false;
  this->PrintLabels = false;
  this->Failover = false;
  this->BatchJobs = false;
  this->ShowOnly = false;
  this->ForceNewCTestProcess = false;
  this->RunConfigurationScript = false;
  this->CompressTestOutput = true;
  this->TestModel = 0;
  this->MaxTestNameWidth = 0x1e;
  this->ParallelLevel = 1;
  this->InteractiveDebugMode = true;
  this->TimeOut = 0.0;
  this->GlobalTimeout = 0.0;
  this->LastStopTimeout = 0x15180;
  this->CompressXMLFiles = false;
  std::__cxx11::string::_M_replace
            ((ulong)local_58,0,(char *)(this->CTestConfigFile)._M_string_length,0x66eafa);
  std::__cxx11::string::_M_replace
            ((ulong)local_98,0,(char *)(this->ScheduleType)._M_string_length,0x66eafa);
  std::__cxx11::string::_M_replace
            ((ulong)local_a0,0,(char *)(this->StopTime)._M_string_length,0x66eafa);
  this->NextDayStopTime = false;
  this->OutputLogFile = (cmGeneratedFileStream *)0x0;
  this->OutputLogFileLastTag = -1;
  this->SuppressUpdatingCTestConfiguration = false;
  this->DartVersion = 1;
  this->DropSiteCDash = false;
  this->OutputTestOutputOnTestFailure = false;
  this->RepeatTests = 1;
  this->RepeatUntilFail = false;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  bVar5 = cmsys::SystemTools::GetEnv("CTEST_OUTPUT_ON_FAILURE",&local_88);
  if (bVar5) {
    bVar5 = cmSystemTools::IsOff(local_88._M_dataplus._M_p);
    this->OutputTestOutputOnTestFailure = !bVar5;
  }
  this->StreamOut = (ostream *)&std::cout;
  this->StreamErr = (ostream *)&std::cerr;
  paVar3 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Start","");
  s = &this->Parts[0].Name;
  std::__cxx11::string::_M_assign((string *)s);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Update","");
  std::__cxx11::string::_M_assign((string *)&this->Parts[1].Name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Configure","");
  std::__cxx11::string::_M_assign((string *)&this->Parts[2].Name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Build","");
  std::__cxx11::string::_M_assign((string *)&this->Parts[3].Name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Test","");
  std::__cxx11::string::_M_assign((string *)&this->Parts[4].Name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Coverage","");
  std::__cxx11::string::_M_assign((string *)&this->Parts[5].Name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"MemCheck","");
  std::__cxx11::string::_M_assign((string *)&this->Parts[6].Name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Submit","");
  std::__cxx11::string::_M_assign((string *)&this->Parts[7].Name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Notes","");
  std::__cxx11::string::_M_assign((string *)&this->Parts[8].Name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"ExtraFiles","");
  std::__cxx11::string::_M_assign((string *)&this->Parts[9].Name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Upload","");
  std::__cxx11::string::_M_assign((string *)&this->Parts[10].Name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  lVar6 = 0;
  do {
    cmsys::SystemTools::LowerCase(&local_c8,s);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTest::Part,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTest::Part>_>_>
             ::operator[](local_90,&local_c8);
    *pmVar7 = (mapped_type)lVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar3) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    lVar6 = lVar6 + 1;
    s = s + 2;
  } while (lVar6 != 0xb);
  this->ShortDateFormat = true;
  this_00 = (cmCTestBuildHandler *)operator_new(0x3b8);
  cmCTestBuildHandler::cmCTestBuildHandler(this_00);
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"build","");
  ppcVar8 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](local_a8,&local_c8);
  *ppcVar8 = (mapped_type)this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  this_01 = (cmCTestBuildAndTestHandler *)operator_new(0x280);
  cmCTestBuildAndTestHandler::cmCTestBuildAndTestHandler(this_01);
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"buildtest","");
  ppcVar8 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](local_a8,&local_c8);
  *ppcVar8 = (mapped_type)this_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  this_02 = (cmCTestCoverageHandler *)operator_new(0x1b8);
  cmCTestCoverageHandler::cmCTestCoverageHandler(this_02);
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"coverage","");
  ppcVar8 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](local_a8,&local_c8);
  *ppcVar8 = (mapped_type)this_02;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  this_03 = (cmCTestScriptHandler *)operator_new(0x2a8);
  cmCTestScriptHandler::cmCTestScriptHandler(this_03);
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"script","");
  ppcVar8 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](local_a8,&local_c8);
  *ppcVar8 = (mapped_type)this_03;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  this_04 = (cmCTestTestHandler *)operator_new(0x790);
  cmCTestTestHandler::cmCTestTestHandler(this_04);
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"test","");
  ppcVar8 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](local_a8,&local_c8);
  *ppcVar8 = (mapped_type)this_04;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  this_05 = (cmCTestUpdateHandler *)operator_new(0xc0);
  cmCTestUpdateHandler::cmCTestUpdateHandler(this_05);
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"update","");
  ppcVar8 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](local_a8,&local_c8);
  *ppcVar8 = (mapped_type)this_05;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  this_06 = (mapped_type)operator_new(0x98);
  cmCTestConfigureHandler::cmCTestConfigureHandler((cmCTestConfigureHandler *)this_06);
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"configure","");
  ppcVar8 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](local_a8,&local_c8);
  *ppcVar8 = this_06;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  this_07 = (cmCTestMemCheckHandler *)operator_new(0x8e8);
  cmCTestMemCheckHandler::cmCTestMemCheckHandler(this_07);
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"memcheck","");
  ppcVar8 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](local_a8,&local_c8);
  *ppcVar8 = (mapped_type)this_07;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  this_08 = (cmCTestSubmitHandler *)operator_new(0x168);
  cmCTestSubmitHandler::cmCTestSubmitHandler(this_08);
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"submit","");
  ppcVar8 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](local_a8,&local_c8);
  *ppcVar8 = (mapped_type)this_08;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  this_09 = (cmCTestUploadHandler *)operator_new(200);
  cmCTestUploadHandler::cmCTestUploadHandler(this_09);
  local_c8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"upload","");
  ppcVar8 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](local_a8,&local_c8);
  *ppcVar8 = (mapped_type)this_09;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar3) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  for (p_Var9 = (this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var9 != p_Var1;
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
    *(cmCTest **)(*(long *)(p_Var9 + 2) + 0x20) = this;
  }
  cmSystemTools::EnableVSConsoleOutput();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

cmCTest::cmCTest()
{
  this->LabelSummary = true;
  this->SubprojectSummary = true;
  this->ParallelLevel = 1;
  this->ParallelLevelSetInCli = false;
  this->TestLoad = 0;
  this->SubmitIndex = 0;
  this->Failover = false;
  this->BatchJobs = false;
  this->ForceNewCTestProcess = false;
  this->TomorrowTag = false;
  this->Verbose = false;

  this->Debug = false;
  this->ShowLineNumbers = false;
  this->Quiet = false;
  this->ExtraVerbose = false;
  this->ProduceXML = false;
  this->ShowOnly = false;
  this->RunConfigurationScript = false;
  this->UseHTTP10 = false;
  this->PrintLabels = false;
  this->CompressTestOutput = true;
  this->TestModel = cmCTest::EXPERIMENTAL;
  this->MaxTestNameWidth = 30;
  this->InteractiveDebugMode = true;
  this->TimeOut = 0;
  this->GlobalTimeout = 0;
  this->LastStopTimeout = 24 * 60 * 60;
  this->CompressXMLFiles = false;
  this->CTestConfigFile = "";
  this->ScheduleType = "";
  this->StopTime = "";
  this->NextDayStopTime = false;
  this->OutputLogFile = CM_NULLPTR;
  this->OutputLogFileLastTag = -1;
  this->SuppressUpdatingCTestConfiguration = false;
  this->DartVersion = 1;
  this->DropSiteCDash = false;
  this->OutputTestOutputOnTestFailure = false;
  this->RepeatTests = 1; // default to run each test once
  this->RepeatUntilFail = false;
  std::string outOnFail;
  if (cmSystemTools::GetEnv("CTEST_OUTPUT_ON_FAILURE", outOnFail)) {
    this->OutputTestOutputOnTestFailure =
      !cmSystemTools::IsOff(outOnFail.c_str());
  }
  this->InitStreams();

  this->Parts[PartStart].SetName("Start");
  this->Parts[PartUpdate].SetName("Update");
  this->Parts[PartConfigure].SetName("Configure");
  this->Parts[PartBuild].SetName("Build");
  this->Parts[PartTest].SetName("Test");
  this->Parts[PartCoverage].SetName("Coverage");
  this->Parts[PartMemCheck].SetName("MemCheck");
  this->Parts[PartSubmit].SetName("Submit");
  this->Parts[PartNotes].SetName("Notes");
  this->Parts[PartExtraFiles].SetName("ExtraFiles");
  this->Parts[PartUpload].SetName("Upload");

  // Fill the part name-to-id map.
  for (Part p = PartStart; p != PartCount; p = Part(p + 1)) {
    this->PartMap[cmSystemTools::LowerCase(this->Parts[p].GetName())] = p;
  }

  this->ShortDateFormat = true;

  this->TestingHandlers["build"] = new cmCTestBuildHandler;
  this->TestingHandlers["buildtest"] = new cmCTestBuildAndTestHandler;
  this->TestingHandlers["coverage"] = new cmCTestCoverageHandler;
  this->TestingHandlers["script"] = new cmCTestScriptHandler;
  this->TestingHandlers["test"] = new cmCTestTestHandler;
  this->TestingHandlers["update"] = new cmCTestUpdateHandler;
  this->TestingHandlers["configure"] = new cmCTestConfigureHandler;
  this->TestingHandlers["memcheck"] = new cmCTestMemCheckHandler;
  this->TestingHandlers["submit"] = new cmCTestSubmitHandler;
  this->TestingHandlers["upload"] = new cmCTestUploadHandler;

  cmCTest::t_TestingHandlers::iterator it;
  for (it = this->TestingHandlers.begin(); it != this->TestingHandlers.end();
       ++it) {
    it->second->SetCTestInstance(this);
  }

  // Make sure we can capture the build tool output.
  cmSystemTools::EnableVSConsoleOutput();
}